

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_processor.cc
# Opt level: O1

void __thiscall
PacketProcessor::run
          (PacketProcessor *this,
          unique_ptr<PacketReader,_std::default_delete<PacketReader>_> *reader,bool verbose)

{
  PacketReader *pPVar1;
  long lVar2;
  pointer puVar3;
  Handler *pHVar4;
  pointer puVar5;
  ostream oVar6;
  int iVar7;
  ostream *poVar8;
  ostream *this_00;
  undefined7 in_register_00000011;
  pointer puVar9;
  pointer puVar10;
  shared_ptr<lrit::File> file;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  spdus;
  array<unsigned_char,_892UL> buf;
  undefined1 local_409;
  VCDU local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_400;
  int local_3f4;
  unique_ptr<PacketReader,_std::default_delete<PacketReader>_> *local_3f0;
  PacketProcessor *local_3e8;
  raw *local_3e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3d8;
  Assembler *local_3d0;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  local_3c8;
  raw local_3ac;
  
  local_3f4 = (int)CONCAT71(in_register_00000011,verbose);
  local_3f0 = reader;
  local_3e8 = this;
  if (local_3f4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Waiting for first packet...",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\r",1);
    poVar8 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[K",3);
  }
  pPVar1 = (local_3f0->_M_t).super___uniq_ptr_impl<PacketReader,_std::default_delete<PacketReader>_>
           ._M_t.super__Tuple_impl<0UL,_PacketReader_*,_std::default_delete<PacketReader>_>.
           super__Head_base<0UL,_PacketReader_*,_false>._M_head_impl;
  iVar7 = (*pPVar1->_vptr_PacketReader[2])(pPVar1,&local_3ac);
  if ((char)iVar7 != '\0') {
    local_3d0 = &local_3e8->assembler_;
    do {
      if ((char)local_3f4 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Packet:",7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," SCID=",6);
        *(undefined8 *)(isalnum + *(long *)(std::cout + -0x18)) = 1;
        poVar8 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,
                            (uint)(byte)(local_3ac._M_elems[0] << 2 | local_3ac._M_elems[1] >> 6));
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," VCID=",6);
        *(undefined8 *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) = 2;
        this_00 = (ostream *)
                  std::ostream::operator<<((ostream *)poVar8,local_3ac._M_elems[1] & 0x3f);
        std::__ostream_insert<char,std::char_traits<char>>(this_00," counter=",9);
        lVar2 = *(long *)this_00;
        *(undefined8 *)(this_00 + *(long *)(lVar2 + -0x18) + 0x10) = 8;
        lVar2 = *(long *)(lVar2 + -0x18);
        poVar8 = this_00 + lVar2;
        if (this_00[lVar2 + 0xe1] == (ostream)0x0) {
          oVar6 = (ostream)std::ios::widen((char)poVar8);
          poVar8[0xe0] = oVar6;
          poVar8[0xe1] = (ostream)0x1;
        }
        poVar8[0xe0] = (ostream)0x30;
        poVar8 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)this_00,
                            (uint)local_3ac._M_elems[4] |
                            (uint)local_3ac._M_elems[3] << 8 | (uint)local_3ac._M_elems[2] << 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\r",1);
        poVar8 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[K",3);
      }
      local_408.data_ = &local_3ac;
      assembler::Assembler::process(&local_3c8,local_3d0,&local_408);
      puVar5 = local_3c8.
               super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar9 = local_3c8.
                    super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar5; puVar9 = puVar9 + 1
          ) {
        local_408.data_ = (raw *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<lrit::File,std::allocator<lrit::File>,std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
                  (&local_400,(File **)&local_408,(allocator<lrit::File> *)&local_409,
                   &((puVar9->_M_t).
                     super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                     .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl)->buf_);
        puVar3 = (local_3e8->handlers_).
                 super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar10 = (local_3e8->handlers_).
                       super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar3;
            puVar10 = puVar10 + 1) {
          pHVar4 = (puVar10->_M_t).super___uniq_ptr_impl<Handler,_std::default_delete<Handler>_>.
                   _M_t.super__Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>.
                   super__Head_base<0UL,_Handler_*,_false>._M_head_impl;
          local_3e0 = local_408.data_;
          local_3d8 = local_400._M_pi;
          if (local_400._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_400._M_pi)->_M_use_count = (local_400._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_400._M_pi)->_M_use_count = (local_400._M_pi)->_M_use_count + 1;
            }
          }
          (**pHVar4->_vptr_Handler)(pHVar4,&local_3e0);
          if (local_3d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d8);
          }
        }
        if (local_400._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_400._M_pi);
        }
      }
      std::
      vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
      ::~vector(&local_3c8);
      pPVar1 = (local_3f0->_M_t).
               super___uniq_ptr_impl<PacketReader,_std::default_delete<PacketReader>_>._M_t.
               super__Tuple_impl<0UL,_PacketReader_*,_std::default_delete<PacketReader>_>.
               super__Head_base<0UL,_PacketReader_*,_false>._M_head_impl;
      iVar7 = (*pPVar1->_vptr_PacketReader[2])(pPVar1,&local_3ac);
    } while ((char)iVar7 != '\0');
  }
  return;
}

Assistant:

void PacketProcessor::run(std::unique_ptr<PacketReader>& reader, bool verbose) {
  if (verbose) {
    std::cout
      << "Waiting for first packet..."
      // Carriage return to return to beginning of line
      << "\r"
      // Flush buffers
      << std::flush
      // Erase in line (expected to be buffered)
      << "\033[K";
  }

  std::array<uint8_t, 892> buf;
  while (reader->nextPacket(buf)) {
    if (verbose) {
      VCDU vcdu(buf);
      std::cout
        << "Packet:"
        << " SCID="
        << std::setw(1) << vcdu.getSCID()
        << " VCID="
        << std::setw(2) << vcdu.getVCID()
        << " counter="
        << std::setw(8) << std::setfill('0') << vcdu.getCounter()
        // Carriage return to return to beginning of line
        << "\r"
        // Flush buffers
        << std::flush
        // Erase in line (expected to be buffered)
        << "\033[K";
    }

    auto spdus = assembler_.process(buf);
    for (auto& spdu : spdus) {
      auto file = std::make_shared<lrit::File>(spdu->get());
      for (auto& handler : handlers_) {
        handler->handle(file);
      }
    }
  }
}